

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

bool Json::convertToDouble(char *str,double *_ret)

{
  int *piVar1;
  double *in_RSI;
  char *in_RDI;
  double dVar2;
  double val;
  char *endptr;
  char *local_20;
  double *local_18;
  char *local_10;
  bool local_1;
  
  local_20 = (char *)0x0;
  local_18 = in_RSI;
  local_10 = in_RDI;
  piVar1 = __errno_location();
  *piVar1 = 0;
  dVar2 = strtod(local_10,&local_20);
  piVar1 = __errno_location();
  if (((*piVar1 == 0x22) &&
      (((dVar2 == INFINITY && (!NAN(dVar2))) || ((dVar2 == -INFINITY && (!NAN(dVar2))))))) ||
     (((piVar1 = __errno_location(), *piVar1 != 0 && (dVar2 == 0.0)) && (!NAN(dVar2))))) {
    local_1 = false;
  }
  else if (local_10 == local_20) {
    local_1 = false;
  }
  else {
    if (local_18 != (double *)0x0) {
      *local_18 = dVar2;
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

static bool
convertToDouble (const char *str, double *_ret)
{
  char *endptr = NULL;
  double val;

  errno = 0; /* To distinguish success/failure after call */
  val = strtod(str, &endptr);

  if ((errno == ERANGE && (val == HUGE_VAL || val == -HUGE_VAL))
      || (errno != 0 && val == 0)) {
    return false;
  }

  if (str == endptr) {
    /* Nothing parsed from the string */
    return false;
  }

  if (_ret != NULL) {
    *_ret = val;
  }

  return true;
}